

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

int trex_charnode(TRex *exp,TRexBool isclass)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  int iVar4;
  ushort **ppuVar5;
  TRexNodeType type;
  
  pcVar3 = exp->_p;
  cVar1 = *pcVar3;
  if ((long)cVar1 == 0x5c) {
    exp->_p = pcVar3 + 1;
    bVar2 = pcVar3[1];
    switch(bVar2) {
    case 0x41:
    case 0x43:
    case 0x44:
    case 0x50:
    case 0x53:
    case 0x57:
    case 0x58:
    case 0x61:
    case 99:
    case 100:
    case 0x6c:
    case 0x70:
    case 0x73:
    case 0x75:
    case 0x77:
    case 0x78:
      exp->_p = pcVar3 + 2;
      iVar4 = trex_newnode(exp,0x106);
      exp->_nodes[iVar4].left = (uint)bVar2;
      return iVar4;
    case 0x42:
    case 0x62:
      if (isclass == 0) {
        iVar4 = trex_newnode(exp,0x10c);
        pcVar3 = exp->_p;
        exp->_nodes[iVar4].left = (int)*pcVar3;
        exp->_p = pcVar3 + 1;
        return iVar4;
      }
    default:
      exp->_p = pcVar3 + 2;
      type = (TRexNodeType)(char)bVar2;
      break;
    case 0x66:
      exp->_p = pcVar3 + 2;
      type = 0xc;
      break;
    case 0x6e:
      exp->_p = pcVar3 + 2;
      type = 10;
      break;
    case 0x72:
      exp->_p = pcVar3 + 2;
      type = 0xd;
      break;
    case 0x74:
      exp->_p = pcVar3 + 2;
      type = 9;
      break;
    case 0x76:
      exp->_p = pcVar3 + 2;
      type = 0xb;
    }
  }
  else {
    ppuVar5 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x40) == 0) {
      if (exp->_error != (char **)0x0) {
        *exp->_error = "letter expected";
      }
      longjmp((__jmp_buf_tag *)exp->_jmpbuf,-1);
    }
    exp->_p = pcVar3 + 1;
    type = (TRexNodeType)cVar1;
  }
  iVar4 = trex_newnode(exp,type);
  return iVar4;
}

Assistant:

static int trex_charnode(TRex* exp, TRexBool isclass) {
    TRexChar t;
    if (*exp->_p == TREX_SYMBOL_ESCAPE_CHAR) {
        exp->_p++;
        switch (*exp->_p) {
            case 'n':
                exp->_p++;
                return trex_newnode(exp, '\n');
            case 't':
                exp->_p++;
                return trex_newnode(exp, '\t');
            case 'r':
                exp->_p++;
                return trex_newnode(exp, '\r');
            case 'f':
                exp->_p++;
                return trex_newnode(exp, '\f');
            case 'v':
                exp->_p++;
                return trex_newnode(exp, '\v');
            case 'a':
            case 'A':
            case 'w':
            case 'W':
            case 's':
            case 'S':
            case 'd':
            case 'D':
            case 'x':
            case 'X':
            case 'c':
            case 'C':
            case 'p':
            case 'P':
            case 'l':
            case 'u': {
                t = *exp->_p;
                exp->_p++;
                return trex_charclass(exp, t);
            }
            case 'b':
            case 'B':
                if (!isclass) {
                    int node = trex_newnode(exp, OP_WB);
                    exp->_nodes[node].left = *exp->_p;
                    exp->_p++;
                    return node;
                }
                /* fall through */
            default:
                t = *exp->_p;
                exp->_p++;
                return trex_newnode(exp, t);
        }
    } else if (!scisprint((int)(*exp->_p))) {
        trex_error(exp, _SC("letter expected"));
    }
    t = *exp->_p;
    exp->_p++;
    return trex_newnode(exp, t);
}